

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O3

void __thiscall egc::Sequencer::SU(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short word;
  unsigned_short uVar3;
  ushort uVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  unsigned_short overflow;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SU",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar6;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,instruction & 0xfff,0);
  uVar3 = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,0,0);
  uVar7 = (~(uint)word & 0x7fff) + (uint)uVar3;
  uVar5 = uVar3 & 0x4000;
  uVar7 = ((uVar7 & 0xffff) >> 0xf) + uVar7;
  uVar4 = (ushort)uVar5;
  overflow = 0x7ffe;
  if ((uVar3 & 0x4000) == 0) {
    overflow = 1;
  }
  uVar5 = uVar7 & 0x3fff | uVar5;
  if (uVar4 == ((ushort)uVar7 & 0x4000) || uVar4 != ((ushort)~(uint)word & 0x4000)) {
    overflow = 0;
    uVar5 = uVar7;
  }
  uVar3 = (unsigned_short)(uVar5 & 0x7fff);
  if ((uVar5 & 0x7fff) == 0) {
    uVar3 = 0x7fff;
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                instruction & 0xfff,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                0,uVar3);
  Memory::SetAccumulatorOverflow
            ((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             overflow);
  return;
}

Assistant:

void egc::Sequencer::SU (unsigned short instruction)
{
    unsigned short k = instruction & 007777u;

    std::cout << "SU" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto a = m_Memory->Read(00000u);

    auto [result, overflow] = AddWords(a, ~mk & 077777u);

    m_Memory->Write(k, mk);
    m_Memory->Write(00000u, result);

    m_Memory->SetAccumulatorOverflow(overflow);
}